

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O3

ssize_t libssh2_channel_read_ex(LIBSSH2_CHANNEL *channel,int stream_id,char *buf,size_t buflen)

{
  LIBSSH2_SESSION *pLVar1;
  int iVar2;
  time_t tVar3;
  ssize_t sVar4;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    return -0x27;
  }
  if ((channel->remote).window_size < buflen) {
    tVar3 = time((time_t *)0x0);
    do {
      iVar2 = _libssh2_channel_receive_window_adjust(channel,(uint32_t)buflen,'\x01',(uint *)0x0);
      if (((iVar2 != -0x25) || (pLVar1 = channel->session, pLVar1 == (LIBSSH2_SESSION *)0x0)) ||
         (pLVar1->api_block_mode == 0)) break;
      iVar2 = _libssh2_wait_socket(pLVar1,tVar3);
    } while (iVar2 == 0);
  }
  tVar3 = time((time_t *)0x0);
  do {
    sVar4 = _libssh2_channel_read(channel,stream_id,buf,buflen);
    if (sVar4 != -0x25) {
      return sVar4;
    }
    pLVar1 = channel->session;
    if (pLVar1 == (LIBSSH2_SESSION *)0x0) {
      return -0x25;
    }
    if (pLVar1->api_block_mode == 0) {
      return -0x25;
    }
    iVar2 = _libssh2_wait_socket(pLVar1,tVar3);
  } while (iVar2 == 0);
  return (long)iVar2;
}

Assistant:

LIBSSH2_API ssize_t
libssh2_channel_read_ex(LIBSSH2_CHANNEL *channel, int stream_id, char *buf,
                        size_t buflen)
{
    ssize_t rc;
    unsigned long recv_window;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    recv_window = libssh2_channel_window_read_ex(channel, NULL, NULL);

    if(buflen > recv_window) {
        BLOCK_ADJUST(rc, channel->session,
                     _libssh2_channel_receive_window_adjust(channel,
                                                   (uint32_t)buflen, 1, NULL));
    }

    BLOCK_ADJUST(rc, channel->session,
                 _libssh2_channel_read(channel, stream_id, buf, buflen));
    return rc;
}